

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctflt.c
# Opt level: O1

void jpeg_fdct_float(float *data)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  
  lVar9 = 0;
  do {
    pfVar2 = (float *)((long)data + lVar9 + 0x50);
    pfVar3 = (float *)((long)data + lVar9 + 0x70);
    pfVar1 = (float *)((long)data + lVar9);
    pfVar4 = (float *)((long)data + lVar9 + 0x10);
    pfVar5 = (float *)((long)data + lVar9 + 0x20);
    pfVar6 = (float *)((long)data + lVar9 + 0x30);
    pfVar7 = (float *)((long)data + lVar9 + 0x40);
    pfVar8 = (float *)((long)data + lVar9 + 0x60);
    fVar18 = *pfVar1 + pfVar4[3];
    fVar19 = *pfVar5 + pfVar6[3];
    fVar20 = *pfVar7 + pfVar2[3];
    fVar21 = *pfVar8 + pfVar3[3];
    fVar14 = *pfVar1 - pfVar4[3];
    fVar15 = *pfVar5 - pfVar6[3];
    fVar16 = *pfVar7 - pfVar2[3];
    fVar17 = *pfVar8 - pfVar3[3];
    fVar42 = pfVar1[1] + pfVar4[2];
    fVar44 = pfVar5[1] + pfVar6[2];
    fVar46 = pfVar7[1] + pfVar2[2];
    fVar48 = pfVar8[1] + pfVar3[2];
    fVar22 = pfVar1[1] - pfVar4[2];
    fVar23 = pfVar5[1] - pfVar6[2];
    fVar24 = pfVar7[1] - pfVar2[2];
    fVar25 = pfVar8[1] - pfVar3[2];
    fVar30 = pfVar1[2] + pfVar4[1];
    fVar31 = pfVar5[2] + pfVar6[1];
    fVar32 = pfVar7[2] + pfVar2[1];
    fVar33 = pfVar8[2] + pfVar3[1];
    fVar26 = pfVar1[2] - pfVar4[1];
    fVar27 = pfVar5[2] - pfVar6[1];
    fVar28 = pfVar7[2] - pfVar2[1];
    fVar29 = pfVar8[2] - pfVar3[1];
    fVar34 = pfVar1[3] + *pfVar4;
    fVar36 = pfVar5[3] + *pfVar6;
    fVar38 = pfVar7[3] + *pfVar2;
    fVar40 = pfVar8[3] + *pfVar3;
    fVar10 = fVar18 + fVar34;
    fVar11 = fVar19 + fVar36;
    fVar12 = fVar20 + fVar38;
    fVar13 = fVar21 + fVar40;
    fVar18 = fVar18 - fVar34;
    fVar19 = fVar19 - fVar36;
    fVar20 = fVar20 - fVar38;
    fVar21 = fVar21 - fVar40;
    fVar35 = fVar42 + fVar30;
    fVar37 = fVar44 + fVar31;
    fVar39 = fVar46 + fVar32;
    fVar41 = fVar48 + fVar33;
    fVar43 = ((fVar42 - fVar30) + fVar18) * 0.70710677;
    fVar45 = ((fVar44 - fVar31) + fVar19) * 0.70710677;
    fVar47 = ((fVar46 - fVar32) + fVar20) * 0.70710677;
    fVar49 = ((fVar48 - fVar33) + fVar21) * 0.70710677;
    fVar30 = (pfVar1[3] - *pfVar4) + fVar26;
    fVar31 = (pfVar5[3] - *pfVar6) + fVar27;
    fVar32 = (pfVar7[3] - *pfVar2) + fVar28;
    fVar33 = (pfVar8[3] - *pfVar3) + fVar29;
    fVar34 = fVar22 + fVar14;
    fVar38 = fVar23 + fVar15;
    fVar42 = fVar24 + fVar16;
    fVar46 = fVar25 + fVar17;
    fVar36 = (fVar30 - fVar34) * 0.38268343;
    fVar40 = (fVar31 - fVar38) * 0.38268343;
    fVar44 = (fVar32 - fVar42) * 0.38268343;
    fVar48 = (fVar33 - fVar46) * 0.38268343;
    fVar30 = fVar30 * 0.5411961 + fVar36;
    fVar31 = fVar31 * 0.5411961 + fVar40;
    fVar32 = fVar32 * 0.5411961 + fVar44;
    fVar33 = fVar33 * 0.5411961 + fVar48;
    fVar36 = fVar34 * 1.306563 + fVar36;
    fVar40 = fVar38 * 1.306563 + fVar40;
    fVar44 = fVar42 * 1.306563 + fVar44;
    fVar48 = fVar46 * 1.306563 + fVar48;
    fVar22 = (fVar26 + fVar22) * 0.70710677;
    fVar34 = (fVar27 + fVar23) * 0.70710677;
    fVar23 = (fVar28 + fVar24) * 0.70710677;
    fVar38 = (fVar29 + fVar25) * 0.70710677;
    fVar24 = fVar14 + fVar22;
    fVar42 = fVar15 + fVar34;
    fVar25 = fVar16 + fVar23;
    fVar46 = fVar17 + fVar38;
    fVar14 = fVar14 - fVar22;
    fVar15 = fVar15 - fVar34;
    fVar16 = fVar16 - fVar23;
    fVar17 = fVar17 - fVar38;
    pfVar1 = (float *)((long)data + lVar9 + 0x60);
    *pfVar1 = fVar41 + fVar13;
    pfVar1[1] = fVar46 + fVar48;
    pfVar1[2] = fVar21 + fVar49;
    pfVar1[3] = fVar17 - fVar33;
    pfVar1 = (float *)((long)data + lVar9 + 0x70);
    *pfVar1 = fVar13 - fVar41;
    pfVar1[1] = fVar17 + fVar33;
    pfVar1[2] = fVar21 - fVar49;
    pfVar1[3] = fVar46 - fVar48;
    pfVar1 = (float *)((long)data + lVar9 + 0x40);
    *pfVar1 = fVar39 + fVar12;
    pfVar1[1] = fVar25 + fVar44;
    pfVar1[2] = fVar20 + fVar47;
    pfVar1[3] = fVar16 - fVar32;
    pfVar1 = (float *)((long)data + lVar9 + 0x50);
    *pfVar1 = fVar12 - fVar39;
    pfVar1[1] = fVar16 + fVar32;
    pfVar1[2] = fVar20 - fVar47;
    pfVar1[3] = fVar25 - fVar44;
    pfVar1 = (float *)((long)data + lVar9 + 0x20);
    *pfVar1 = fVar37 + fVar11;
    pfVar1[1] = fVar42 + fVar40;
    pfVar1[2] = fVar19 + fVar45;
    pfVar1[3] = fVar15 - fVar31;
    pfVar1 = (float *)((long)data + lVar9 + 0x30);
    *pfVar1 = fVar11 - fVar37;
    pfVar1[1] = fVar15 + fVar31;
    pfVar1[2] = fVar19 - fVar45;
    pfVar1[3] = fVar42 - fVar40;
    pfVar1 = (float *)((long)data + lVar9);
    *pfVar1 = fVar35 + fVar10;
    pfVar1[1] = fVar24 + fVar36;
    pfVar1[2] = fVar18 + fVar43;
    pfVar1[3] = fVar14 - fVar30;
    pfVar1 = (float *)((long)data + lVar9 + 0x10);
    *pfVar1 = fVar10 - fVar35;
    pfVar1[1] = fVar14 + fVar30;
    pfVar1[2] = fVar18 - fVar43;
    pfVar1[3] = fVar24 - fVar36;
    lVar9 = lVar9 + 0x80;
  } while (lVar9 != 0x100);
  lVar9 = -8;
  do {
    pfVar4 = data + lVar9 + 0x40;
    pfVar1 = data + lVar9 + 8;
    pfVar2 = data + lVar9 + 0x10;
    pfVar3 = data + lVar9 + 0x18;
    pfVar5 = data + lVar9 + 0x20;
    fVar10 = *pfVar5;
    fVar11 = pfVar5[1];
    fVar12 = pfVar5[2];
    fVar13 = pfVar5[3];
    fVar35 = *pfVar1 + *pfVar4;
    fVar37 = pfVar1[1] + pfVar4[1];
    fVar39 = pfVar1[2] + pfVar4[2];
    fVar41 = pfVar1[3] + pfVar4[3];
    fVar44 = *pfVar1 - *pfVar4;
    fVar25 = pfVar1[1] - pfVar4[1];
    fVar46 = pfVar1[2] - pfVar4[2];
    fVar48 = pfVar1[3] - pfVar4[3];
    pfVar1 = data + lVar9 + 0x38;
    fVar43 = *pfVar2 + *pfVar1;
    fVar45 = pfVar2[1] + pfVar1[1];
    fVar47 = pfVar2[2] + pfVar1[2];
    fVar49 = pfVar2[3] + pfVar1[3];
    fVar38 = *pfVar2 - *pfVar1;
    fVar40 = pfVar2[1] - pfVar1[1];
    fVar24 = pfVar2[2] - pfVar1[2];
    fVar42 = pfVar2[3] - pfVar1[3];
    pfVar1 = data + lVar9 + 0x30;
    fVar18 = *pfVar3 + *pfVar1;
    fVar19 = pfVar3[1] + pfVar1[1];
    fVar20 = pfVar3[2] + pfVar1[2];
    fVar21 = pfVar3[3] + pfVar1[3];
    fVar26 = *pfVar3 - *pfVar1;
    fVar27 = pfVar3[1] - pfVar1[1];
    fVar28 = pfVar3[2] - pfVar1[2];
    fVar29 = pfVar3[3] - pfVar1[3];
    pfVar1 = data + lVar9 + 0x28;
    fVar14 = *pfVar1;
    fVar15 = pfVar1[1];
    fVar16 = pfVar1[2];
    fVar17 = pfVar1[3];
    fVar22 = fVar10 + fVar14;
    fVar34 = fVar11 + fVar15;
    fVar36 = fVar12 + fVar16;
    fVar23 = fVar13 + fVar17;
    fVar30 = fVar35 + fVar22;
    fVar31 = fVar37 + fVar34;
    fVar32 = fVar39 + fVar36;
    fVar33 = fVar41 + fVar23;
    fVar35 = fVar35 - fVar22;
    fVar37 = fVar37 - fVar34;
    fVar39 = fVar39 - fVar36;
    fVar41 = fVar41 - fVar23;
    fVar22 = fVar43 + fVar18;
    fVar34 = fVar45 + fVar19;
    fVar36 = fVar47 + fVar20;
    fVar23 = fVar49 + fVar21;
    pfVar1 = data + lVar9 + 8;
    *pfVar1 = fVar22 + fVar30;
    pfVar1[1] = fVar34 + fVar31;
    pfVar1[2] = fVar36 + fVar32;
    pfVar1[3] = fVar23 + fVar33;
    pfVar1 = data + lVar9 + 0x28;
    *pfVar1 = fVar30 - fVar22;
    pfVar1[1] = fVar31 - fVar34;
    pfVar1[2] = fVar32 - fVar36;
    pfVar1[3] = fVar33 - fVar23;
    fVar30 = ((fVar43 - fVar18) + fVar35) * 0.70710677;
    fVar31 = ((fVar45 - fVar19) + fVar37) * 0.70710677;
    fVar32 = ((fVar47 - fVar20) + fVar39) * 0.70710677;
    fVar33 = ((fVar49 - fVar21) + fVar41) * 0.70710677;
    pfVar1 = data + lVar9 + 0x18;
    *pfVar1 = fVar35 + fVar30;
    pfVar1[1] = fVar37 + fVar31;
    pfVar1[2] = fVar39 + fVar32;
    pfVar1[3] = fVar41 + fVar33;
    pfVar1 = data + lVar9 + 0x38;
    *pfVar1 = fVar35 - fVar30;
    pfVar1[1] = fVar37 - fVar31;
    pfVar1[2] = fVar39 - fVar32;
    pfVar1[3] = fVar41 - fVar33;
    fVar30 = (fVar10 - fVar14) + fVar26;
    fVar31 = (fVar11 - fVar15) + fVar27;
    fVar32 = (fVar12 - fVar16) + fVar28;
    fVar33 = (fVar13 - fVar17) + fVar29;
    fVar11 = fVar38 + fVar44;
    fVar13 = fVar40 + fVar25;
    fVar15 = fVar24 + fVar46;
    fVar17 = fVar42 + fVar48;
    fVar10 = (fVar30 - fVar11) * 0.38268343;
    fVar12 = (fVar31 - fVar13) * 0.38268343;
    fVar14 = (fVar32 - fVar15) * 0.38268343;
    fVar16 = (fVar33 - fVar17) * 0.38268343;
    fVar30 = fVar30 * 0.5411961 + fVar10;
    fVar31 = fVar31 * 0.5411961 + fVar12;
    fVar32 = fVar32 * 0.5411961 + fVar14;
    fVar33 = fVar33 * 0.5411961 + fVar16;
    fVar10 = fVar11 * 1.306563 + fVar10;
    fVar12 = fVar13 * 1.306563 + fVar12;
    fVar14 = fVar15 * 1.306563 + fVar14;
    fVar16 = fVar17 * 1.306563 + fVar16;
    fVar18 = (fVar26 + fVar38) * 0.70710677;
    fVar19 = (fVar27 + fVar40) * 0.70710677;
    fVar20 = (fVar28 + fVar24) * 0.70710677;
    fVar21 = (fVar29 + fVar42) * 0.70710677;
    fVar11 = fVar44 + fVar18;
    fVar13 = fVar25 + fVar19;
    fVar15 = fVar46 + fVar20;
    fVar17 = fVar48 + fVar21;
    fVar44 = fVar44 - fVar18;
    fVar25 = fVar25 - fVar19;
    fVar46 = fVar46 - fVar20;
    fVar48 = fVar48 - fVar21;
    pfVar1 = data + lVar9 + 0x30;
    *pfVar1 = fVar44 + fVar30;
    pfVar1[1] = fVar25 + fVar31;
    pfVar1[2] = fVar46 + fVar32;
    pfVar1[3] = fVar48 + fVar33;
    pfVar1 = data + lVar9 + 0x20;
    *pfVar1 = fVar44 - fVar30;
    pfVar1[1] = fVar25 - fVar31;
    pfVar1[2] = fVar46 - fVar32;
    pfVar1[3] = fVar48 - fVar33;
    pfVar1 = data + lVar9 + 0x10;
    *pfVar1 = fVar11 + fVar10;
    pfVar1[1] = fVar13 + fVar12;
    pfVar1[2] = fVar15 + fVar14;
    pfVar1[3] = fVar17 + fVar16;
    pfVar1 = data + lVar9 + 0x40;
    *pfVar1 = fVar11 - fVar10;
    pfVar1[1] = fVar13 - fVar12;
    pfVar1[2] = fVar15 - fVar14;
    pfVar1[3] = fVar17 - fVar16;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_float(FAST_FLOAT *data)
{
  FAST_FLOAT tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  FAST_FLOAT tmp10, tmp11, tmp12, tmp13;
  FAST_FLOAT z1, z2, z3, z4, z5, z11, z13;
  FAST_FLOAT *dataptr;
  int ctr;

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[0] + dataptr[7];
    tmp7 = dataptr[0] - dataptr[7];
    tmp1 = dataptr[1] + dataptr[6];
    tmp6 = dataptr[1] - dataptr[6];
    tmp2 = dataptr[2] + dataptr[5];
    tmp5 = dataptr[2] - dataptr[5];
    tmp3 = dataptr[3] + dataptr[4];
    tmp4 = dataptr[3] - dataptr[4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[0] = tmp10 + tmp11; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT)0.707106781); /* c4 */
    dataptr[2] = tmp13 + z1;    /* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT)0.382683433); /* c6 */
    z2 = ((FAST_FLOAT)0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT)1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT)0.707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;      /* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;         /* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE * 0] + dataptr[DCTSIZE * 7];
    tmp7 = dataptr[DCTSIZE * 0] - dataptr[DCTSIZE * 7];
    tmp1 = dataptr[DCTSIZE * 1] + dataptr[DCTSIZE * 6];
    tmp6 = dataptr[DCTSIZE * 1] - dataptr[DCTSIZE * 6];
    tmp2 = dataptr[DCTSIZE * 2] + dataptr[DCTSIZE * 5];
    tmp5 = dataptr[DCTSIZE * 2] - dataptr[DCTSIZE * 5];
    tmp3 = dataptr[DCTSIZE * 3] + dataptr[DCTSIZE * 4];
    tmp4 = dataptr[DCTSIZE * 3] - dataptr[DCTSIZE * 4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE * 0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE * 4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT)0.707106781); /* c4 */
    dataptr[DCTSIZE * 2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE * 6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT)0.382683433); /* c6 */
    z2 = ((FAST_FLOAT)0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT)1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT)0.707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE * 5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE * 3] = z13 - z2;
    dataptr[DCTSIZE * 1] = z11 + z4;
    dataptr[DCTSIZE * 7] = z11 - z4;

    dataptr++;                  /* advance pointer to next column */
  }
}